

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  uint *puVar1;
  Type TVar2;
  uint uVar3;
  int *piVar4;
  pointer pnVar5;
  undefined8 uVar6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  SPxId *pSVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  type_conflict5 tVar13;
  int iVar14;
  ulong uVar15;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar16;
  pointer pnVar17;
  uint *puVar18;
  uint local_190;
  uint local_18c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined4 local_144;
  pointer local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  pointer local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  pointer local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  uint *local_88;
  uint *local_80;
  long local_78;
  uint *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems[6] = 0;
  local_f8.data._M_elems[7] = 0;
  local_f8.data._M_elems[8] = 0;
  local_f8.data._M_elems[9] = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  local_188.m_backend.fpclass = cpp_dec_float_finite;
  local_188.m_backend.prec_elem = 10;
  local_188.m_backend.data._M_elems[0] = 0;
  local_188.m_backend.data._M_elems[1] = 0;
  local_188.m_backend.data._M_elems[2] = 0;
  local_188.m_backend.data._M_elems[3] = 0;
  local_188.m_backend.data._M_elems[4] = 0;
  local_188.m_backend.data._M_elems[5] = 0;
  local_188.m_backend.data._M_elems._24_5_ = 0;
  local_188.m_backend.data._M_elems[7]._1_3_ = 0;
  local_188.m_backend.data._M_elems._32_5_ = 0;
  local_188.m_backend.data._M_elems[9]._1_3_ = 0;
  local_188.m_backend.exp = 0;
  local_188.m_backend.neg = false;
  TVar2 = (this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_type;
  if (TVar2 == LEAVE) {
    local_144 = 0;
  }
  else {
    pSVar7 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_144 = (undefined4)CONCAT71((int7)((ulong)pSVar7 >> 8),pSVar7->theRep == ROW);
  }
  local_98 = (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_140 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (update->thedelta).super_IdxSet.idx;
  pnVar5 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (uint *)(piVar4 + (update->thedelta).super_IdxSet.num);
  puVar18 = (uint *)(piVar4 + start);
  local_88 = (stab->m_backend).data._M_elems + 1;
  local_78 = (long)incr << 2;
  local_190 = 0xffffffff;
  local_18c = local_190;
  local_150 = stab;
  local_b8 = bestDelta;
  local_a8 = val;
  local_a0 = best;
  local_90 = max;
  do {
    if (local_70 <= puVar18) {
      if (0 < (int)local_190 && (int)local_18c < 0) {
        uVar15 = (ulong)local_190;
        result_1.m_backend.data._M_elems._0_8_ =
             result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar13 = boost::multiprecision::operator>(pnVar5 + uVar15,(int *)&result_1);
        pnVar17 = local_b0;
        pnVar5 = local_140;
        if (tVar13) {
          pnVar17 = local_140;
          pnVar5 = local_98;
        }
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&pnVar5[uVar15].m_backend,&pnVar17[uVar15].m_backend);
        *(ulong *)((local_b8->m_backend).data._M_elems + 8) =
             CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                      result_1.m_backend.data._M_elems._32_5_);
        *(undefined8 *)((local_b8->m_backend).data._M_elems + 4) =
             result_1.m_backend.data._M_elems._16_8_;
        *(ulong *)((local_b8->m_backend).data._M_elems + 6) =
             CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                      result_1.m_backend.data._M_elems._24_5_);
        *(undefined8 *)(local_b8->m_backend).data._M_elems = result_1.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_b8->m_backend).data._M_elems + 2) =
             result_1.m_backend.data._M_elems._8_8_;
        (local_b8->m_backend).exp = result_1.m_backend.exp;
        (local_b8->m_backend).neg = result_1.m_backend.neg;
        (local_b8->m_backend).fpclass = result_1.m_backend.fpclass;
        (local_b8->m_backend).prec_elem = result_1.m_backend.prec_elem;
      }
      return local_18c;
    }
    uVar3 = *puVar18;
    uVar6 = *(undefined8 *)((long)&pnVar5[(int)uVar3].m_backend.data + 0x20);
    local_f8.data._M_elems[8] = (uint)uVar6;
    local_f8.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
    uVar6 = *(undefined8 *)&pnVar5[(int)uVar3].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[(int)uVar3].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[(int)uVar3].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    local_f8.data._M_elems[4] = (uint)uVar10;
    local_f8.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
    local_f8.data._M_elems[6] = (uint)uVar11;
    local_f8.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
    local_f8.data._M_elems[0] = (uint)uVar6;
    local_f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
    local_f8.data._M_elems[2] = (uint)uVar9;
    local_f8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
    local_f8.exp = pnVar5[(int)uVar3].m_backend.exp;
    local_f8.neg = pnVar5[(int)uVar3].m_backend.neg;
    local_f8.fpclass = pnVar5[(int)uVar3].m_backend.fpclass;
    local_f8.prec_elem = pnVar5[(int)uVar3].m_backend.prec_elem;
    if (TVar2 == LEAVE) {
      pSVar7 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      if (this->iscoid == true) {
        pDVar16 = (pSVar7->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat;
      }
      else {
        pDVar16 = (pSVar7->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.stat;
      }
      if (pSVar7->theRep * pDVar16->data[(int)uVar3] < 1) goto LAB_0027992c;
    }
    else {
LAB_0027992c:
      if ((char)local_144 != '\0') {
        pSVar7 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pSVar8 = (pSVar7->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data;
        if (0 < pSVar8[(int)uVar3].super_DataKey.info) {
          local_80 = puVar18;
          SPxColId::SPxColId((SPxColId *)&result_1.m_backend,pSVar8 + (int)uVar3);
          puVar18 = local_80;
          iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   ::number(&(pSVar7->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set,(DataKey *)&result_1.m_backend);
          if ((pSVar7->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[iVar14] == P_FIXED) goto LAB_00279d73;
        }
      }
      tVar13 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_f8,local_150);
      if (tVar13) {
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,&local_98[(int)uVar3].m_backend,
                   &local_140[(int)uVar3].m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&result.m_backend,&local_f8);
        local_188.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_188.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_188.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_188.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_188.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
        local_188.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
        local_188.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_188.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_188.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_188.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_188.m_backend.exp = result_1.m_backend.exp;
        local_188.m_backend.neg = result_1.m_backend.neg;
        local_188.m_backend.fpclass = result_1.m_backend.fpclass;
        local_188.m_backend.prec_elem = result_1.m_backend.prec_elem;
        tVar13 = boost::multiprecision::operator<=(&local_188,local_90);
        if (tVar13) {
          *(ulong *)((local_a8->m_backend).data._M_elems + 8) =
               CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                        local_188.m_backend.data._M_elems._32_5_);
          *(undefined8 *)((local_a8->m_backend).data._M_elems + 4) =
               local_188.m_backend.data._M_elems._16_8_;
          *(ulong *)((local_a8->m_backend).data._M_elems + 6) =
               CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                        local_188.m_backend.data._M_elems._24_5_);
          *(undefined8 *)(local_a8->m_backend).data._M_elems =
               local_188.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((local_a8->m_backend).data._M_elems + 2) =
               local_188.m_backend.data._M_elems._8_8_;
          (local_a8->m_backend).exp = local_188.m_backend.exp;
          (local_a8->m_backend).neg = local_188.m_backend.neg;
          (local_a8->m_backend).fpclass = local_188.m_backend.fpclass;
          (local_a8->m_backend).prec_elem = local_188.m_backend.prec_elem;
          *(ulong *)((local_150->m_backend).data._M_elems + 8) =
               CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
          *(ulong *)((local_150->m_backend).data._M_elems + 4) =
               CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
          *(ulong *)((local_150->m_backend).data._M_elems + 6) =
               CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
          *(ulong *)(local_150->m_backend).data._M_elems =
               CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
          *(ulong *)((local_150->m_backend).data._M_elems + 2) =
               CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
          (local_150->m_backend).exp = local_f8.exp;
          (local_150->m_backend).neg = local_f8.neg;
          (local_150->m_backend).fpclass = local_f8.fpclass;
          (local_150->m_backend).prec_elem = local_f8.prec_elem;
          local_18c = uVar3;
        }
        else {
LAB_00279d1a:
          pnVar12 = local_a0;
          tVar13 = boost::multiprecision::operator>(&local_188,local_a0);
          if (tVar13) {
            *(ulong *)((pnVar12->m_backend).data._M_elems + 8) =
                 CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                          local_188.m_backend.data._M_elems._32_5_);
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 4) =
                 local_188.m_backend.data._M_elems._16_8_;
            *(ulong *)((pnVar12->m_backend).data._M_elems + 6) =
                 CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                          local_188.m_backend.data._M_elems._24_5_);
            *(undefined8 *)(pnVar12->m_backend).data._M_elems =
                 local_188.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 2) =
                 local_188.m_backend.data._M_elems._8_8_;
            (pnVar12->m_backend).exp = local_188.m_backend.exp;
            (pnVar12->m_backend).neg = local_188.m_backend.neg;
            (pnVar12->m_backend).fpclass = local_188.m_backend.fpclass;
            (pnVar12->m_backend).prec_elem = local_188.m_backend.prec_elem;
            local_190 = uVar3;
          }
        }
      }
      else {
        uVar6 = *(undefined8 *)((local_150->m_backend).data._M_elems + 8);
        result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
        result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_150->m_backend).data._M_elems
        ;
        result_1.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((local_150->m_backend).data._M_elems + 2);
        result_1.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((local_150->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((local_150->m_backend).data._M_elems + 6);
        result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        result_1.m_backend.exp = (local_150->m_backend).exp;
        result_1.m_backend.neg = (local_150->m_backend).neg;
        result_1.m_backend.fpclass = (local_150->m_backend).fpclass;
        result_1.m_backend.prec_elem = (local_150->m_backend).prec_elem;
        if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
            result_1.m_backend.data._M_elems[0] != 0) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
        tVar13 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f8,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&result_1.m_backend);
        if (tVar13) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,&local_b0[(int)uVar3].m_backend,
                     &local_140[(int)uVar3].m_backend);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&local_f8);
          local_188.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_188.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_188.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_188.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_188.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_188.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_188.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_188.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_188.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_188.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_188.m_backend.exp = result_1.m_backend.exp;
          local_188.m_backend.neg = result_1.m_backend.neg;
          local_188.m_backend.fpclass = result_1.m_backend.fpclass;
          local_188.m_backend.prec_elem = result_1.m_backend.prec_elem;
          tVar13 = boost::multiprecision::operator<=(&local_188,local_90);
          if (!tVar13) goto LAB_00279d1a;
          *(ulong *)((local_a8->m_backend).data._M_elems + 8) =
               CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                        local_188.m_backend.data._M_elems._32_5_);
          *(undefined8 *)((local_a8->m_backend).data._M_elems + 4) =
               local_188.m_backend.data._M_elems._16_8_;
          *(ulong *)((local_a8->m_backend).data._M_elems + 6) =
               CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                        local_188.m_backend.data._M_elems._24_5_);
          *(undefined8 *)(local_a8->m_backend).data._M_elems =
               local_188.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((local_a8->m_backend).data._M_elems + 2) =
               local_188.m_backend.data._M_elems._8_8_;
          (local_a8->m_backend).exp = local_188.m_backend.exp;
          (local_a8->m_backend).neg = local_188.m_backend.neg;
          (local_a8->m_backend).fpclass = local_188.m_backend.fpclass;
          (local_a8->m_backend).prec_elem = local_188.m_backend.prec_elem;
          (local_150->m_backend).data._M_elems[0] = local_f8.data._M_elems[0];
          local_88[8] = local_f8.data._M_elems[9];
          *(ulong *)(local_88 + 4) = CONCAT44(local_f8.data._M_elems[6],local_f8.data._M_elems[5]);
          *(ulong *)(local_88 + 6) = CONCAT44(local_f8.data._M_elems[8],local_f8.data._M_elems[7]);
          *(ulong *)local_88 = CONCAT44(local_f8.data._M_elems[2],local_f8.data._M_elems[1]);
          *(ulong *)(local_88 + 2) = CONCAT44(local_f8.data._M_elems[4],local_f8.data._M_elems[3]);
          (local_150->m_backend).exp = local_f8.exp;
          (local_150->m_backend).neg =
               (bool)((local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) ^
                     local_f8.neg);
          (local_150->m_backend).fpclass = local_f8.fpclass;
          (local_150->m_backend).prec_elem = local_f8.prec_elem;
          local_18c = uVar3;
        }
      }
    }
LAB_00279d73:
    puVar18 = (uint *)((long)puVar18 + local_78);
  } while( true );
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}